

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Factory.cpp
# Opt level: O3

void SoapySDR::Device::unmake(Device *device)

{
  _Base_ptr *pp_Var1;
  pointer pmVar2;
  _Base_ptr p_Var3;
  runtime_error *this;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *args;
  key_type *__k;
  iterator __position;
  pair<std::_Rb_tree_iterator<std::pair<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_SoapySDR::Device_*>_>,_std::_Rb_tree_iterator<std::pair<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_SoapySDR::Device_*>_>_>
  pVar4;
  unique_lock<std::recursive_mutex> lock;
  KwargsList argsList;
  unique_lock<std::recursive_mutex> local_48;
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_38;
  
  if (device == (Device *)0x0) {
    return;
  }
  local_48._M_device = (mutex_type *)getFactoryMutex()::mutex;
  local_48._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_48);
  local_48._M_owns = true;
  getDeviceCounts();
  if (getDeviceCounts::table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
      (_Base_ptr)0x0) {
    __position._M_node = &getDeviceCounts::table._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var3 = getDeviceCounts::table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      if (*(Device **)(p_Var3 + 1) >= device) {
        __position._M_node = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[*(Device **)(p_Var3 + 1) < device];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)__position._M_node !=
         &getDeviceCounts::table._M_t._M_impl.super__Rb_tree_header) &&
       (*(Device **)(__position._M_node + 1) <= device)) {
      getDeviceCounts();
      pp_Var1 = &__position._M_node[1]._M_parent;
      *pp_Var1 = (_Base_ptr)((long)&(*pp_Var1)[-1]._M_right + 7);
      if (*pp_Var1 == (_Base_ptr)0x0) {
        getDeviceCounts();
        std::
        _Rb_tree<SoapySDR::Device*,std::pair<SoapySDR::Device*const,unsigned_long>,std::_Select1st<std::pair<SoapySDR::Device*const,unsigned_long>>,std::less<SoapySDR::Device*>,std::allocator<std::pair<SoapySDR::Device*const,unsigned_long>>>
        ::erase_abi_cxx11_((_Rb_tree<SoapySDR::Device*,std::pair<SoapySDR::Device*const,unsigned_long>,std::_Select1st<std::pair<SoapySDR::Device*const,unsigned_long>>,std::less<SoapySDR::Device*>,std::allocator<std::pair<SoapySDR::Device*const,unsigned_long>>>
                            *)&getDeviceCounts::table,__position);
        local_38.
        super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
        local_38.
        super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
        local_38.
        super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        getDeviceTable_abi_cxx11_();
        if ((_Rb_tree_header *)
            getDeviceTable[abi:cxx11]()::table_abi_cxx11_._M_t._M_impl.super__Rb_tree_header.
            _M_header._M_left !=
            &getDeviceTable[abi:cxx11]()::table_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
          p_Var3 = getDeviceTable[abi:cxx11]()::table_abi_cxx11_._M_t._M_impl.super__Rb_tree_header.
                   _M_header._M_left;
          do {
            if (p_Var3[2]._M_left == (_Base_ptr)device) {
              std::
              vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ::push_back(&local_38,(value_type *)(p_Var3 + 1));
              p_Var3[2]._M_left = (_Base_ptr)0x0;
            }
            p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
          } while ((_Rb_tree_header *)p_Var3 !=
                   &getDeviceTable[abi:cxx11]()::table_abi_cxx11_._M_t._M_impl.super__Rb_tree_header
                  );
        }
        std::unique_lock<std::recursive_mutex>::unlock(&local_48);
        (*device->_vptr_Device[1])(device);
        std::unique_lock<std::recursive_mutex>::lock(&local_48);
        pmVar2 = local_38.
                 super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (__k = local_38.
                   super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; __k != pmVar2; __k = __k + 1) {
          getDeviceTable_abi_cxx11_();
          pVar4 = std::_Rb_tree<$be4b8079$>::equal_range
                            (&getDeviceTable[abi:cxx11]()::table_abi_cxx11_._M_t,__k);
          std::_Rb_tree<$be4b8079$>::_M_erase_aux
                    (&getDeviceTable[abi:cxx11]()::table_abi_cxx11_._M_t,
                     (_Base_ptr)pVar4.first._M_node,(_Base_ptr)pVar4.second._M_node);
        }
        std::
        vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~vector(&local_38);
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&local_48);
      return;
    }
  }
  getDeviceCounts();
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"SoapySDR::Device::unmake() unknown device");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SoapySDR::Device::unmake(Device *device)
{
    if (device == nullptr) return; //safe to unmake a null device

    std::unique_lock<std::recursive_mutex> lock(getFactoryMutex());

    auto countIt = getDeviceCounts().find(device);
    if (countIt == getDeviceCounts().end())
    {
        throw std::runtime_error("SoapySDR::Device::unmake() unknown device");
    }

    if ((--countIt->second) != 0) return;

    //cleanup case for last instance of open device
    getDeviceCounts().erase(countIt);

    //nullify matching entries in the device table
    //make throws if it matches handles which are being deleted
    KwargsList argsList;
    for (auto &it : getDeviceTable())
    {
        if (it.second != device) continue;
        argsList.push_back(it.first);
        it.second = nullptr;
    }

    //do not block other callers while we wait on destructor
    lock.unlock();
    delete device;
    lock.lock();

    //now clean the device table to signal that deletion is complete
    for (const auto &args : argsList) getDeviceTable().erase(args);
}